

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_115e484::SpeakerDelegate::speaker_did_complete_samples
          (SpeakerDelegate *this,Speaker *param_1,vector<short,_std::allocator<short>_> *buffer)

{
  int iVar1;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  vector<short,_std::allocator<short>_> *this_00;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_80;
  const_iterator local_78;
  short *local_70;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_58;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_50;
  const_iterator local_48;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_40;
  const_iterator local_38;
  ulong local_30;
  size_t buffer_size;
  lock_guard<std::mutex> lock_guard;
  vector<short,_std::allocator<short>_> *buffer_local;
  Speaker *param_1_local;
  SpeakerDelegate *this_local;
  
  lock_guard._M_device = (mutex_type *)buffer;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&buffer_size,&this->audio_buffer_mutex_);
  iVar1 = 1;
  if ((this->is_stereo & 1U) != 0) {
    iVar1 = 2;
  }
  local_30 = (long)iVar1 << 10;
  sVar2 = std::vector<short,_std::allocator<short>_>::size(&this->audio_buffer_);
  if (local_30 < sVar2) {
    this_00 = &this->audio_buffer_;
    local_40._M_current = (short *)std::vector<short,_std::allocator<short>_>::begin(this_00);
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_38
               ,&local_40);
    local_58._M_current = (short *)std::vector<short,_std::allocator<short>_>::end(this_00);
    local_50 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator-(&local_58,local_30);
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_48
               ,&local_50);
    local_70 = (short *)std::vector<short,_std::allocator<short>_>::erase(this_00,local_38,local_48)
    ;
  }
  local_80._M_current =
       (short *)std::vector<short,_std::allocator<short>_>::end(&this->audio_buffer_);
  __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
  __normal_iterator<short*>
            ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_78,
             &local_80);
  __first = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)lock_guard._M_device);
  __last = std::vector<short,_std::allocator<short>_>::end
                     ((vector<short,_std::allocator<short>_> *)lock_guard._M_device);
  std::vector<short,std::allocator<short>>::
  insert<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>,void>
            ((vector<short,std::allocator<short>> *)&this->audio_buffer_,local_78,
             (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>)
             __first._M_current,
             (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>)
             __last._M_current);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&buffer_size);
  return;
}

Assistant:

void speaker_did_complete_samples(Outputs::Speaker::Speaker *, const std::vector<int16_t> &buffer) final {
		std::lock_guard lock_guard(audio_buffer_mutex_);
		const size_t buffer_size = buffered_samples * (is_stereo ? 2 : 1);
		if(audio_buffer_.size() > buffer_size) {
			audio_buffer_.erase(audio_buffer_.begin(), audio_buffer_.end() - buffer_size);
		}
		audio_buffer_.insert(audio_buffer_.end(), buffer.begin(), buffer.end());
	}